

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit
          (Stack<rapidjson::CrtAllocator> *this)

{
  size_t newCapacity;
  
  newCapacity = (long)this->stackTop_ - (long)this->stack_;
  if (newCapacity != 0) {
    Resize(this,newCapacity);
    return;
  }
  free(this->stack_);
  this->stack_ = (char *)0x0;
  this->stackTop_ = (char *)0x0;
  this->stackEnd_ = (char *)0x0;
  return;
}

Assistant:

void ShrinkToFit() { 
        if (Empty()) {
            // If the stack is empty, completely deallocate the memory.
            Allocator::Free(stack_);
            stack_ = 0;
            stackTop_ = 0;
            stackEnd_ = 0;
        }
        else
            Resize(GetSize());
    }